

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_converter_reset(ma_data_converter *pConverter)

{
  ma_resampling_backend_vtable *pmVar1;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr *UNRECOVERED_JUMPTABLE;
  ma_result mVar2;
  
  if (pConverter == (ma_data_converter *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    if (pConverter->hasResampler == '\0') {
      return MA_SUCCESS;
    }
    pmVar1 = (pConverter->resampler).pBackendVTable;
    mVar2 = MA_NOT_IMPLEMENTED;
    if ((pmVar1 != (ma_resampling_backend_vtable *)0x0) &&
       (UNRECOVERED_JUMPTABLE = pmVar1->onReset,
       UNRECOVERED_JUMPTABLE != (_func_ma_result_void_ptr_ma_resampling_backend_ptr *)0x0)) {
      mVar2 = (*UNRECOVERED_JUMPTABLE)
                        ((pConverter->resampler).pBackendUserData,(pConverter->resampler).pBackend);
      return mVar2;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_data_converter_reset(ma_data_converter* pConverter)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    /* There's nothing to do if we're not resampling. */
    if (pConverter->hasResampler == MA_FALSE) {
        return MA_SUCCESS;
    }

    return ma_resampler_reset(&pConverter->resampler);
}